

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
peach::exception::PositionalError::PositionalError
          (PositionalError *this,size_t line,size_t position,string *exceptionClass,string *comment)

{
  string local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *comment_local;
  string *exceptionClass_local;
  size_t position_local;
  size_t line_local;
  PositionalError *this_local;
  
  local_30 = comment;
  comment_local = exceptionClass;
  exceptionClass_local = (string *)position;
  position_local = line;
  line_local = (size_t)this;
  std::operator+(&local_b0,comment," at ");
  std::__cxx11::to_string(&local_d0,position_local);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90,":");
  std::__cxx11::to_string(&local_100,(unsigned_long)exceptionClass_local);
  std::operator+(&local_50,&local_70,&local_100);
  PeachException::PeachException(&this->super_PeachException,exceptionClass,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  *(undefined ***)&this->super_PeachException = &PTR__PositionalError_001d9618;
  this->line_ = position_local;
  this->position_ = (size_t)exceptionClass_local;
  return;
}

Assistant:

PositionalError(std::size_t line,
                    std::size_t position,
                    const std::string &exceptionClass,
                    const std::string &comment)
        : PeachException(exceptionClass,
                         comment + " at " +
                             std::to_string(line) +
                             ":" + std::to_string(position)),
          line_(line),
          position_(position)
    {
    }